

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.hpp
# Opt level: O0

void __thiscall actorpp::Actor::Actor(Actor *this)

{
  Actor *this_local;
  
  std::make_shared<actorpp::detail::ActorImpl>();
  return;
}

Assistant:

Actor() : impl(std::make_shared<detail::ActorImpl>()) {}